

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O3

BrandedDecl * __thiscall
capnp::compiler::NodeTranslator::BrandScope::interpretResolve
          (BrandedDecl *__return_storage_ptr__,BrandScope *this,Resolver *resolver,
          ResolveResult *result,Reader source)

{
  anon_union_96_2_a774ebf0_for_OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_3
  *paVar1;
  undefined8 *puVar2;
  byte bVar3;
  void *pvVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  Reader brand;
  undefined8 *puVar13;
  Resolver *resolver_00;
  long *plVar14;
  CapTableReader *pCVar15;
  int iVar16;
  bool bVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  Own<capnp::compiler::NodeTranslator::BrandScope> OVar20;
  NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> local_268;
  undefined1 local_188 [16];
  undefined1 local_178 [8];
  undefined8 uStack_170;
  anon_union_96_2_a774ebf0_for_OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_3
  local_168;
  Disposer *local_108;
  BrandScope *local_100;
  SegmentReader *local_f8;
  CapTableReader *pCStack_f0;
  void *local_e8;
  WirePointer *pWStack_e0;
  StructDataBitCount local_d8;
  StructPointerCount SStack_d4;
  undefined2 uStack_d2;
  undefined8 uStack_d0;
  void *local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  byte local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  ListReader local_60;
  
  if (result->tag == 1) {
    paVar1 = &result->field_1;
    pop((BrandScope *)&local_268,(uint64_t)this);
    local_a0 = (result->field_1).space[0x28];
    puVar2 = (undefined8 *)((long)&result->field_1 + 0x30);
    if (local_a0 == '\x01') {
      resolver_00 = (Resolver *)CONCAT44(local_268.field_1._4_4_,local_268.field_1.value.body.tag);
      local_c8 = paVar1->forceAligned;
      uStack_c0 = *(undefined8 *)((long)&result->field_1 + 8);
      local_b8 = *(undefined8 *)((long)&result->field_1 + 0x10);
      uStack_b0 = *(undefined8 *)((long)&result->field_1 + 0x18);
      local_a8 = *(undefined8 *)((long)&result->field_1 + 0x20);
      local_98 = *puVar2;
      uStack_90 = *(undefined8 *)((long)&result->field_1 + 0x38);
      local_88 = *(undefined8 *)((long)&result->field_1 + 0x40);
      uStack_80 = *(undefined8 *)((long)&result->field_1 + 0x48);
      local_78 = *(undefined8 *)((long)&result->field_1 + 0x50);
      uStack_70 = *(undefined8 *)((long)&result->field_1 + 0x58);
      bVar17 = *(short *)((long)&result->field_1 + 0x54) == 0;
      local_168.forceAligned = *(BrandScope **)((long)&result->field_1 + 0x48);
      if (bVar17) {
        local_168.forceAligned = (BrandScope *)0x0;
      }
      iVar16 = 0x7fffffff;
      if (!bVar17) {
        iVar16 = *(int *)((long)&result->field_1 + 0x58);
      }
      local_178._0_4_ = 0;
      local_178._4_4_ = 0;
      uVar18 = 0;
      uVar19 = 0;
      if (!bVar17) {
        local_178._0_4_ = *(undefined4 *)((long)&result->field_1 + 0x30);
        local_178._4_4_ = *(undefined4 *)((long)&result->field_1 + 0x34);
        uVar18 = *(undefined4 *)((long)&result->field_1 + 0x38);
        uVar19 = *(undefined4 *)((long)&result->field_1 + 0x3c);
      }
      uStack_170 = (CapTableReader *)CONCAT44(uVar19,uVar18);
      local_168._8_4_ = iVar16;
      capnp::_::PointerReader::getList
                (&local_60,(PointerReader *)local_178,INLINE_COMPOSITE,(word *)0x0);
      brand.reader.capTable = local_60.capTable;
      brand.reader.segment = local_60.segment;
      brand.reader.ptr = local_60.ptr;
      brand.reader.elementCount = local_60.elementCount;
      brand.reader.step = local_60.step;
      brand.reader.structDataSize = local_60.structDataSize;
      brand.reader.structPointerCount = local_60.structPointerCount;
      brand.reader.elementSize = local_60.elementSize;
      brand.reader._39_1_ = local_60._39_1_;
      brand.reader.nestingLimit = local_60.nestingLimit;
      brand.reader._44_4_ = local_60._44_4_;
      OVar20 = evaluateBrand((BrandScope *)local_188,resolver_00,(ResolvedDecl *)resolver,brand,
                             (uint)&local_c8);
      puVar13 = (undefined8 *)CONCAT44(local_268._4_4_,local_268._0_4_);
      plVar14 = (long *)CONCAT44(local_268.field_1._4_4_,local_268.field_1.value.body.tag);
      local_268._0_4_ = local_188._0_4_;
      local_268._4_4_ = local_188._4_4_;
      local_268.field_1.value.body.tag = local_188._8_4_;
      local_268.field_1._4_4_ = local_188._12_4_;
      if (plVar14 != (long *)0x0) {
        (**(code **)*puVar13)(puVar13,(long)plVar14 + *(long *)(*plVar14 + -0x10),OVar20.ptr);
      }
    }
    else {
      OVar20 = push((BrandScope *)local_178,
                    CONCAT44(local_268.field_1._4_4_,local_268.field_1.value.body.tag),
                    (uint)*(undefined8 *)&result->field_1);
      puVar13 = (undefined8 *)CONCAT44(local_268._4_4_,local_268._0_4_);
      plVar14 = (long *)CONCAT44(local_268.field_1._4_4_,local_268.field_1.value.body.tag);
      local_268._0_4_ = local_178._0_4_;
      local_268._4_4_ = local_178._4_4_;
      local_268.field_1.value.body.tag = (uint)uStack_170;
      local_268.field_1._4_4_ = uStack_170._4_4_;
      uStack_170 = (CapTableReader *)0x0;
      if (plVar14 != (long *)0x0) {
        (**(code **)*puVar13)(puVar13,(long)plVar14 + *(long *)(*plVar14 + -0x10),OVar20.ptr);
        pCVar15 = uStack_170;
        if (uStack_170 != (CapTableReader *)0x0) {
          uStack_170 = (CapTableReader *)0x0;
          (*(code *)**(undefined8 **)CONCAT44(local_178._4_4_,local_178._0_4_))
                    ((undefined8 *)CONCAT44(local_178._4_4_,local_178._0_4_),
                     pCVar15->_vptr_CapTableReader[-2] + (long)&pCVar15->_vptr_CapTableReader);
        }
      }
    }
    bVar3 = (result->field_1).space[0x28];
    if (bVar3 == '\x01') {
      uVar5 = *puVar2;
      uVar6 = *(undefined8 *)((long)&result->field_1 + 0x38);
      uVar7 = *(undefined8 *)((long)&result->field_1 + 0x40);
      uVar8 = *(undefined8 *)((long)&result->field_1 + 0x48);
      uVar9 = *(undefined8 *)((long)&result->field_1 + 0x50);
      uVar10 = *(undefined8 *)((long)&result->field_1 + 0x58);
      (__return_storage_ptr__->source)._reader.dataSize = source._reader.dataSize;
      (__return_storage_ptr__->source)._reader.pointerCount = source._reader.pointerCount;
      *(undefined2 *)&(__return_storage_ptr__->source)._reader.field_0x26 = source._reader._38_2_;
      (__return_storage_ptr__->source)._reader.nestingLimit = source._reader.nestingLimit;
      *(undefined4 *)&(__return_storage_ptr__->source)._reader.field_0x2c = source._reader._44_4_;
      (__return_storage_ptr__->source)._reader.data = source._reader.data;
      (__return_storage_ptr__->source)._reader.pointers = source._reader.pointers;
      (__return_storage_ptr__->source)._reader.segment = source._reader.segment;
      (__return_storage_ptr__->source)._reader.capTable = source._reader.capTable;
      (__return_storage_ptr__->brand).disposer =
           (Disposer *)CONCAT44(local_268._4_4_,local_268._0_4_);
      (__return_storage_ptr__->brand).ptr =
           (BrandScope *)CONCAT44(local_268.field_1._4_4_,local_268.field_1.value.body.tag);
      *(undefined8 *)((long)&(__return_storage_ptr__->body).field_1 + 0x20) =
           *(undefined8 *)((long)&result->field_1 + 0x20);
      pvVar4 = paVar1->forceAligned;
      uVar11 = *(undefined8 *)((long)&result->field_1 + 8);
      uVar12 = *(undefined8 *)((long)&result->field_1 + 0x18);
      *(undefined8 *)((long)&(__return_storage_ptr__->body).field_1 + 0x10) =
           *(undefined8 *)((long)&result->field_1 + 0x10);
      *(undefined8 *)((long)&(__return_storage_ptr__->body).field_1 + 0x18) = uVar12;
      (__return_storage_ptr__->body).field_1.forceAligned = pvVar4;
      *(undefined8 *)((long)&(__return_storage_ptr__->body).field_1 + 8) = uVar11;
      (__return_storage_ptr__->body).field_1.space[0x28] = '\x01';
      *(undefined8 *)((long)&(__return_storage_ptr__->body).field_1 + 0x30) = uVar5;
      *(undefined8 *)((long)&(__return_storage_ptr__->body).field_1 + 0x38) = uVar6;
      *(undefined8 *)((long)&(__return_storage_ptr__->body).field_1 + 0x40) = uVar7;
      *(undefined8 *)((long)&(__return_storage_ptr__->body).field_1 + 0x48) = uVar8;
      *(undefined8 *)((long)&(__return_storage_ptr__->body).field_1 + 0x50) = uVar9;
      *(undefined8 *)((long)&(__return_storage_ptr__->body).field_1 + 0x58) = uVar10;
    }
    else {
      (__return_storage_ptr__->source)._reader.dataSize = source._reader.dataSize;
      (__return_storage_ptr__->source)._reader.pointerCount = source._reader.pointerCount;
      *(undefined2 *)&(__return_storage_ptr__->source)._reader.field_0x26 = source._reader._38_2_;
      (__return_storage_ptr__->source)._reader.nestingLimit = source._reader.nestingLimit;
      *(undefined4 *)&(__return_storage_ptr__->source)._reader.field_0x2c = source._reader._44_4_;
      (__return_storage_ptr__->source)._reader.data = source._reader.data;
      (__return_storage_ptr__->source)._reader.pointers = source._reader.pointers;
      (__return_storage_ptr__->source)._reader.segment = source._reader.segment;
      (__return_storage_ptr__->source)._reader.capTable = source._reader.capTable;
      (__return_storage_ptr__->brand).disposer =
           (Disposer *)CONCAT44(local_268._4_4_,local_268._0_4_);
      (__return_storage_ptr__->brand).ptr =
           (BrandScope *)CONCAT44(local_268.field_1._4_4_,local_268.field_1.value.body.tag);
      *(undefined8 *)((long)&(__return_storage_ptr__->body).field_1 + 0x20) =
           *(undefined8 *)((long)&result->field_1 + 0x20);
      pvVar4 = paVar1->forceAligned;
      uVar5 = *(undefined8 *)((long)&result->field_1 + 8);
      uVar6 = *(undefined8 *)((long)&result->field_1 + 0x18);
      *(undefined8 *)((long)&(__return_storage_ptr__->body).field_1 + 0x10) =
           *(undefined8 *)((long)&result->field_1 + 0x10);
      *(undefined8 *)((long)&(__return_storage_ptr__->body).field_1 + 0x18) = uVar6;
      (__return_storage_ptr__->body).field_1.forceAligned = pvVar4;
      *(undefined8 *)((long)&(__return_storage_ptr__->body).field_1 + 8) = uVar5;
      (__return_storage_ptr__->body).field_1.space[0x28] = bVar3;
    }
    (__return_storage_ptr__->body).tag = 1;
  }
  else {
    lookupParameter((Maybe<capnp::compiler::NodeTranslator::BrandedDecl> *)&local_268,this,resolver,
                    (uint64_t)(result->field_1).forceAligned,*(uint *)((long)&result->field_1 + 8));
    local_178[0] = local_268.isSet;
    if (local_268.isSet == true) {
      uStack_170 = (CapTableReader *)CONCAT44(uStack_170._4_4_,local_268.field_1.value.body.tag);
      if (local_268.field_1.value.body.tag == 2) {
        local_168.forceAligned = (void *)local_268.field_1._8_8_;
        local_168._8_8_ = local_268.field_1._16_8_;
      }
      else if (local_268.field_1.value.body.tag == 1) {
        local_168._32_8_ = local_268.field_1._40_8_;
        local_168._16_8_ = local_268.field_1._24_8_;
        local_168._24_8_ = local_268.field_1._32_8_;
        local_168.forceAligned = (void *)local_268.field_1._8_8_;
        local_168._8_8_ = local_268.field_1._16_8_;
        local_168.space[0x28] = local_268.field_1._48_1_;
        if (local_268.field_1._48_1_ == '\x01') {
          local_168._80_8_ = local_268.field_1._88_8_;
          local_168._88_8_ = local_268.field_1._96_8_;
          local_168._64_8_ = local_268.field_1._72_8_;
          local_168._72_8_ = local_268.field_1._80_8_;
          local_168._48_8_ = local_268.field_1._56_8_;
          local_168._56_8_ = local_268.field_1._64_8_;
        }
      }
      local_108 = local_268.field_1.value.brand.disposer;
      local_100 = local_268.field_1.value.brand.ptr;
      local_f8 = local_268.field_1.value.source._reader.segment;
      pCStack_f0 = local_268.field_1.value.source._reader.capTable;
      local_e8 = local_268.field_1.value.source._reader.data;
      pWStack_e0 = local_268.field_1.value.source._reader.pointers;
      local_d8 = local_268.field_1.value.source._reader.dataSize;
      SStack_d4 = local_268.field_1.value.source._reader.pointerCount;
      uStack_d2 = local_268.field_1._158_2_;
      uStack_d0 = local_268.field_1._160_8_;
      BrandedDecl::BrandedDecl(__return_storage_ptr__,(BrandedDecl *)&uStack_170);
      if (local_268.field_1.value.brand.ptr != (BrandScope *)0x0) {
        (**(local_268.field_1.value.brand.disposer)->_vptr_Disposer)
                  (local_268.field_1.value.brand.disposer,
                   ((local_268.field_1.value.brand.ptr)->super_Refcounted).super_Disposer.
                   _vptr_Disposer[-2] +
                   (long)&((local_268.field_1.value.brand.ptr)->super_Refcounted).super_Disposer.
                          _vptr_Disposer);
      }
    }
    else {
      pvVar4 = (result->field_1).forceAligned;
      uVar18 = *(undefined4 *)((long)&result->field_1 + 8);
      (__return_storage_ptr__->source)._reader.dataSize = source._reader.dataSize;
      (__return_storage_ptr__->source)._reader.pointerCount = source._reader.pointerCount;
      *(undefined2 *)&(__return_storage_ptr__->source)._reader.field_0x26 = source._reader._38_2_;
      (__return_storage_ptr__->source)._reader.nestingLimit = source._reader.nestingLimit;
      *(undefined4 *)&(__return_storage_ptr__->source)._reader.field_0x2c = source._reader._44_4_;
      (__return_storage_ptr__->source)._reader.data = source._reader.data;
      (__return_storage_ptr__->source)._reader.pointers = source._reader.pointers;
      (__return_storage_ptr__->source)._reader.segment = source._reader.segment;
      (__return_storage_ptr__->source)._reader.capTable = source._reader.capTable;
      (__return_storage_ptr__->brand).disposer = (Disposer *)0x0;
      (__return_storage_ptr__->brand).ptr = (BrandScope *)0x0;
      (__return_storage_ptr__->body).field_1.forceAligned = pvVar4;
      *(undefined4 *)((long)&(__return_storage_ptr__->body).field_1 + 8) = uVar18;
      (__return_storage_ptr__->body).tag = 2;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

NodeTranslator::BrandedDecl NodeTranslator::BrandScope::interpretResolve(
    Resolver& resolver, Resolver::ResolveResult& result, Expression::Reader source) {
  if (result.is<Resolver::ResolvedDecl>()) {
    auto& decl = result.get<Resolver::ResolvedDecl>();

    auto scope = pop(decl.scopeId);
    KJ_IF_MAYBE(brand, decl.brand) {
      scope = scope->evaluateBrand(resolver, decl, brand->getScopes());
    } else {
      scope = scope->push(decl.id, decl.genericParamCount);
    }

    return BrandedDecl(decl, kj::mv(scope), source);
  }